

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

ModportSubroutinePortListSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ModportSubroutinePortListSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>const&,slang::parsing::Token&,slang::syntax::SeparatedSyntaxList<slang::syntax::ModportPortSyntax>const&>
          (BumpAllocator *this,SyntaxList<slang::syntax::AttributeInstanceSyntax> *args,
          Token *args_1,SeparatedSyntaxList<slang::syntax::ModportPortSyntax> *args_2)

{
  Token importExport;
  ModportSubroutinePortListSyntax *this_00;
  
  this_00 = (ModportSubroutinePortListSyntax *)allocate(this,0x98,8);
  importExport.kind = args_1->kind;
  importExport._2_1_ = args_1->field_0x2;
  importExport.numFlags.raw = (args_1->numFlags).raw;
  importExport.rawLen = args_1->rawLen;
  importExport.info = args_1->info;
  slang::syntax::ModportSubroutinePortListSyntax::ModportSubroutinePortListSyntax
            (this_00,args,importExport,args_2);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }